

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_7zip.c
# Opt level: O1

int make_substreamsInfo(archive_write *a,coder *coders)

{
  void *pvVar1;
  uint uVar2;
  undefined8 in_RAX;
  ulong uVar3;
  ulong unaff_RBP;
  long *plVar4;
  long lVar5;
  uint8_t crc [4];
  undefined8 uStack_28;
  
  pvVar1 = a->format_data;
  uStack_28 = in_RAX;
  uVar2 = enc_uint64(a,8);
  if (-1 < (int)uVar2) {
    if ((*(ulong *)((long)pvVar1 + 0x20) < 2) || (coders->codec == 0)) {
LAB_005d64ec:
      uVar2 = enc_uint64(a,10);
      if ((-1 < (int)uVar2) && (uVar2 = enc_uint64(a,1), -1 < (int)uVar2)) {
        lVar5 = *(long *)((long)pvVar1 + 0xf110);
        if (lVar5 != 0) {
          do {
            if (*(long *)(lVar5 + 0x30) == 0) {
              uVar2 = 5;
            }
            else {
              uStack_28 = CONCAT44(*(undefined4 *)(lVar5 + 0x74),(undefined4)uStack_28);
              uVar3 = compress_out(a,(void *)((long)&uStack_28 + 4),4,ARCHIVE_Z_RUN);
              if ((int)(uint)uVar3 < 0) {
                unaff_RBP = uVar3;
              }
              unaff_RBP = unaff_RBP & 0xffffffff;
              uVar2 = (uint)uVar3 >> 0x1f;
            }
            if (uVar2 != 0) {
              if (uVar2 != 5) {
                return (int)unaff_RBP;
              }
              break;
            }
            lVar5 = *(long *)(lVar5 + 0x18);
          } while (lVar5 != 0);
        }
        uVar2 = enc_uint64(a,0);
        uVar2 = (int)uVar2 >> 0x1f & uVar2;
      }
    }
    else {
      uVar2 = enc_uint64(a,0xd);
      if ((-1 < (int)uVar2) &&
         ((uVar2 = enc_uint64(a,*(uint64_t *)((long)pvVar1 + 0x20)), -1 < (int)uVar2 &&
          (uVar2 = enc_uint64(a,9), -1 < (int)uVar2)))) {
        plVar4 = (long *)((long)pvVar1 + 0xf110);
        do {
          lVar5 = *plVar4;
          if (((lVar5 == 0) || (*(long *)(lVar5 + 0x18) == 0)) ||
             (*(long *)(*(long *)(lVar5 + 0x18) + 0x30) == 0)) goto LAB_005d64ec;
          plVar4 = (long *)(lVar5 + 0x18);
          uVar2 = enc_uint64(a,*(uint64_t *)(lVar5 + 0x30));
          unaff_RBP = (ulong)uVar2;
        } while (-1 < (int)uVar2);
      }
    }
  }
  return uVar2;
}

Assistant:

static int
make_substreamsInfo(struct archive_write *a, struct coder *coders)
{
	struct _7zip *zip = (struct _7zip *)a->format_data;
	struct file *file;
	int r;

	/*
	 * Make SubStreamsInfo.
	 */
	r = enc_uint64(a, kSubStreamsInfo);
	if (r < 0)
		return (r);

	if (zip->total_number_nonempty_entry > 1 && coders->codec != _7Z_COPY) {
		/*
		 * Make NumUnPackStream.
		 */
		r = enc_uint64(a, kNumUnPackStream);
		if (r < 0)
			return (r);

		/* Write numUnpackStreams */
		r = enc_uint64(a, zip->total_number_nonempty_entry);
		if (r < 0)
			return (r);

		/*
		 * Make kSize.
		 */
		r = enc_uint64(a, kSize);
		if (r < 0)
			return (r);
		file = zip->file_list.first;
		for (;file != NULL; file = file->next) {
			if (file->next == NULL ||
			    file->next->size == 0)
				break;
			r = enc_uint64(a, file->size);
			if (r < 0)
				return (r);
		}
	}

	/*
	 * Make CRC.
	 */
	r = enc_uint64(a, kCRC);
	if (r < 0)
		return (r);


	/* All are defined */
	r = enc_uint64(a, 1);
	if (r < 0)
		return (r);
	file = zip->file_list.first;
	for (;file != NULL; file = file->next) {
		uint8_t crc[4];
		if (file->size == 0)
			break;
		archive_le32enc(crc, file->crc32);
		r = (int)compress_out(a, crc, 4, ARCHIVE_Z_RUN);
		if (r < 0)
			return (r);
	}

	/* Write End. */
	r = enc_uint64(a, kEnd);
	if (r < 0)
		return (r);
	return (ARCHIVE_OK);
}